

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O0

void __thiscall Centaurus::ATNNode<unsigned_char>::ATNNode(ATNNode<unsigned_char> *this)

{
  ATNNode<unsigned_char> *this_local;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_00296738;
  std::
  vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ::vector(&this->m_transitions);
  this->m_type = Blank;
  Identifier::Identifier(&this->m_invoke);
  NFA<unsigned_char>::NFA(&this->m_nfa);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string(&this->m_literal);
  this->m_localid = -1;
  return;
}

Assistant:

ATNNode()
        : m_type(ATNNodeType::Blank), m_localid(-1)
    {
    }